

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

string * __thiscall
helics::logLevelToString_abi_cxx11_(string *__return_storage_ptr__,helics *this,LogLevels level)

{
  pointer pcVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint uVar6;
  long lVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  uint __val;
  uint uVar10;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar10 = (uint)this;
  if (levelMaps._16_8_ != 0) {
    lVar4 = 0x5815b0;
    lVar7 = levelMaps._16_8_;
    do {
      if ((int)uVar10 <= *(int *)(lVar7 + 0x20)) {
        lVar4 = lVar7;
      }
      lVar7 = *(long *)(lVar7 + 0x10 + (ulong)(*(int *)(lVar7 + 0x20) < (int)uVar10) * 8);
    } while (lVar7 != 0);
    if ((lVar4 != 0x5815b0) && (*(int *)(lVar4 + 0x20) <= (int)uVar10)) {
      lVar7 = *(long *)(lVar4 + 0x30);
      lVar4 = *(long *)(lVar4 + 0x28);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,lVar7,lVar4 + lVar7);
      return __return_storage_ptr__;
    }
  }
  __val = -uVar10;
  if (0 < (int)uVar10) {
    __val = uVar10;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_003e7316;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_003e7316;
      }
      if (uVar6 < 10000) goto LAB_003e7316;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_003e7316:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)(__len + -((int)uVar10 >> 0x1f)),'-');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + (uint)-((int)uVar10 >> 0x1f),__len,__val);
  pbVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_50,0,0,"loglevel_",9);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar2 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string logLevelToString(LogLevels level)
{
    auto res = levelMaps.find(level);
    if (res != levelMaps.end()) {
        return std::string(res->second);
    }
    std::string ret = "loglevel_" + std::to_string(static_cast<int>(level));
    return ret;
}